

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STL_Exercises.cpp
# Opt level: O2

void Question_1(void)

{
  istream *piVar1;
  long lVar2;
  int i;
  int iVar3;
  int m;
  int n;
  int b;
  int a;
  vector<int,_std::allocator<int>_> v [10005];
  int iStack_3aa2c;
  int iStack_3aa28;
  int iStack_3aa24;
  int iStack_3aa20;
  int iStack_3aa1c;
  _Vector_base<int,_std::allocator<int>_> a_Stack_3aa18 [10005];
  
  memset(a_Stack_3aa18,0,0x3a9f8);
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&iStack_3aa24);
  std::istream::operator>>(piVar1,&iStack_3aa28);
  for (iStack_3aa2c = 0; iStack_3aa2c < iStack_3aa24; iStack_3aa2c = iStack_3aa2c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)(a_Stack_3aa18 + iStack_3aa2c),&iStack_3aa2c);
  }
  for (iVar3 = 0; iVar3 < iStack_3aa28; iVar3 = iVar3 + 1) {
    piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&iStack_3aa1c);
    std::istream::operator>>(piVar1,&iStack_3aa20);
  }
  lVar2 = 0x3a9e0;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&a_Stack_3aa18[0]._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return;
}

Assistant:

void Question_1()
{
    vector<int> v[10005]; //vector<int> 数组
    int a,b,n,m;
    cin >> n >> m;
    for (int i = 0; i < n; ++i) {
        v[i].push_back(i);
    }
    for(int i = 0; i < m; i++)
    {
        cin >> a >> b;
        if (a == b)
        {
            continue;
        }

    }
}